

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenMatrixBaseSerialize.hpp
# Opt level: O2

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
serialize<boost::archive::text_oarchive>
          (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,text_oarchive *ar,
          uint version)

{
  long lVar1;
  int i;
  long lVar2;
  int j;
  int iVar3;
  int c;
  int r;
  int local_30;
  int local_2c;
  
  local_2c = (int)(this->m_storage).m_rows;
  local_30 = 1;
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_2c);
  boost::archive::save_access::save_primitive<boost::archive::text_oarchive,int>(ar,&local_30);
  resize(this,(long)local_2c,(long)local_30);
  for (iVar3 = 0; iVar3 < local_30; iVar3 = iVar3 + 1) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < local_2c; lVar2 = lVar2 + 1) {
      boost::archive::save_access::save_primitive<boost::archive::text_oarchive,double>
                (ar,(double *)((long)(this->m_storage).m_data + lVar1));
      lVar1 = lVar1 + 8;
    }
  }
  return;
}

Assistant:

inline void serialize(Archive & ar, const unsigned int version)
{
    int r = this->rows();     // makes sense for saving only
    int c = this->cols();

    ar & boost::serialization::make_nvp("rows",r);
    ar & boost::serialization::make_nvp("cols",c);

    this->resize(r,c);        // makes sense for loading only

    for(int j = 0; j < c; j++)
	    for(int i = 0; i < r; i++)
            ar & boost::serialization::make_nvp("data",this->operator()(i,j));
}